

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O2

QVariant * __thiscall
SongListModel::data(QVariant *__return_storage_ptr__,SongListModel *this,QModelIndex *index,int role
                   )

{
  bool bVar1;
  pointer args_1;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  bVar1 = QModelIndex::isValid(index);
  if ((bVar1) && ((role & 0xfffffffdU) == 0)) {
    args_1 = (this->mSongData).
             super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>.
             _M_impl.super__Vector_impl_data._M_start + index->r;
    if (role == 0) {
      local_80.d = (Data *)0x0;
      local_80.ptr = L"%1# %2";
      local_80.size = 6;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      QString::number((int)&local_50,index->r + 1);
      QString::arg<QString,QString_const&>
                ((type *)&local_38,(QString *)&local_80,(QString *)&local_50,&args_1->name);
      QVariant::QVariant(__return_storage_ptr__,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
    else {
      QVariant::QVariant(__return_storage_ptr__,(QString *)args_1);
    }
  }
  else {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant SongListModel::data(QModelIndex const& index, int role) const {

    if (index.isValid()) {
        switch (role) {
            case Qt::DisplayRole:
            case Qt::EditRole: {
                auto const& meta = mSongData[index.row()];
                if (role == Qt::DisplayRole) {
                    return QStringLiteral("%1# %2").arg(QString::number(index.row() + 1), meta.name);
                } else {
                    return meta.name;
                }
            }
            default:
                break;
        }
    }

    return {};

}